

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autosolve.cpp
# Opt level: O0

void enqueue_corner(min_heap *to_expand,node *parent,Pyraminx *pyraminx,Corner *ref_corner,int g)

{
  move_type to_apply;
  int iVar1;
  node *this;
  node *local_60;
  Corner local_54;
  Direction DStack_50;
  move_type child_move;
  int dir;
  int layer;
  int f_child;
  int g_child;
  int h_child;
  Direction undo_dir;
  Direction move_dir;
  int g_local;
  Corner *ref_corner_local;
  Pyraminx *pyraminx_local;
  node *parent_local;
  min_heap *to_expand_local;
  
  for (child_move.dir = clockwise; (int)child_move.dir < 4;
      child_move.dir = child_move.dir + counterclockwise) {
    for (child_move.layer = 0; child_move.layer < 2; child_move.layer = child_move.layer + 1) {
      h_child = (int)(child_move.layer != 0);
      g_child = (int)(child_move.layer == 0);
      Pyraminx::turn_layer(pyraminx,*ref_corner,child_move.dir,h_child);
      iVar1 = Pyraminx::get_heuristic(pyraminx);
      local_54 = *ref_corner;
      DStack_50 = child_move.dir;
      child_move.ref_corner = h_child;
      this = (node *)operator_new(0x18);
      to_apply.layer = DStack_50;
      to_apply.ref_corner = local_54;
      to_apply.dir = child_move.ref_corner;
      node::node(this,g + 1 + iVar1,to_apply,parent);
      local_60 = this;
      std::priority_queue<node_*,_std::vector<node_*,_std::allocator<node_*>_>,_Compare>::push
                (to_expand,&local_60);
      Pyraminx::turn_layer(pyraminx,*ref_corner,child_move.dir,g_child);
    }
  }
  return;
}

Assistant:

void enqueue_corner(min_heap& to_expand, const node* parent, Pyraminx& pyraminx, const Corner& ref_corner, int g){
    // for each possible layer and direction:
    // apply move
    // calculate new f value
    // enqueue new move list and corresponding value
    // undo move
    Direction move_dir;
    Direction undo_dir;
    int h_child;
    int g_child;
    int f_child; 
    for(int layer = 0; layer < 4; layer++){ // iterate layers
        for(int dir = 0; dir < 2; dir++){ // iterate directions
            if(dir == 0){
                move_dir = Direction::clockwise;
                undo_dir = Direction::counterclockwise;
            }
            else{
                move_dir = Direction::counterclockwise;
                undo_dir = Direction::clockwise;
            }
            // Get cost by applying move to pyraminx
            pyraminx.turn_layer(ref_corner, layer, move_dir); 
            h_child = pyraminx.get_heuristic(); 
            g_child = g + 1;
            f_child = g_child + h_child;
            move_type child_move{ .ref_corner=ref_corner, .layer= layer, .dir=move_dir};
        
            // Add to min-heap
            /**std::cout << "Adding node (corner: " << (int) ref_corner <<
                "layer: " << layer << 
                "direction: " << dir <<  
                ") with cost " << f_child << std::endl;
            **/
            to_expand.push(new node(f_child, child_move, parent));
            // Undo test to calculate cost
            pyraminx.turn_layer(ref_corner, layer, undo_dir);
        }
    }
}